

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O3

bool P_Thing_Raise(AActor *thing,AActor *raiser)

{
  uint uVar1;
  BYTE *pBVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  FState *newstate;
  undefined4 extraout_var;
  bool bVar7;
  FSoundID local_4c;
  double local_48;
  double dStack_40;
  DVector2 local_38;
  PClass *pPVar6;
  
  newstate = AActor::GetRaiseState(thing);
  bVar7 = true;
  if (newstate != (FState *)0x0) {
    pPVar6 = (thing->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar5 = (**(thing->super_DThinker).super_DObject._vptr_DObject)(thing);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar5);
      (thing->super_DThinker).super_DObject.Class = pPVar6;
    }
    pBVar2 = pPVar6->Defaults;
    (thing->Vel).X = 0.0;
    (thing->Vel).Y = 0.0;
    local_48 = thing->radius;
    dStack_40 = thing->Height;
    uVar1 = (thing->flags).Value;
    (thing->flags).Value = uVar1 | 2;
    dVar3 = *(double *)(pBVar2 + 0x180);
    thing->radius = *(double *)(pBVar2 + 0x178);
    thing->Height = dVar3;
    local_38.X = (thing->__Pos).X;
    local_38.Y = (thing->__Pos).Y;
    bVar4 = P_CheckPosition(thing,&local_38,false);
    if (bVar4) {
      local_4c.ID = S_FindSound("vile/raise");
      S_Sound(thing,4,&local_4c,1.0,1.001);
      AActor::Revive(thing);
      if (raiser != (AActor *)0x0) {
        AActor::CopyFriendliness(thing,raiser,false,true);
      }
      AActor::SetState(thing,newstate,false);
    }
    else {
      (thing->flags).Value = uVar1;
      thing->radius = local_48;
      thing->Height = dStack_40;
      bVar7 = false;
    }
  }
  return bVar7;
}

Assistant:

bool P_Thing_Raise(AActor *thing, AActor *raiser)
{
	FState * RaiseState = thing->GetRaiseState();
	if (RaiseState == NULL)
	{
		return true;	// monster doesn't have a raise state
	}
	
	AActor *info = thing->GetDefault ();

	thing->Vel.X = thing->Vel.Y = 0;

	// [RH] Check against real height and radius
	double oldheight = thing->Height;
	double oldradius = thing->radius;
	ActorFlags oldflags = thing->flags;

	thing->flags |= MF_SOLID;
	thing->Height = info->Height;	// [RH] Use real height
	thing->radius = info->radius;	// [RH] Use real radius
	if (!P_CheckPosition (thing, thing->Pos()))
	{
		thing->flags = oldflags;
		thing->radius = oldradius;
		thing->Height = oldheight;
		return false;
	}


	S_Sound (thing, CHAN_BODY, "vile/raise", 1, ATTN_IDLE);

	thing->Revive();

	if (raiser != NULL)
	{
		// Let's copy the friendliness of the one who raised it.
		thing->CopyFriendliness(raiser, false);
	}

	thing->SetState (RaiseState);
	return true;
}